

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::Initialize(ImGuiContext *context)

{
  int *piVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiViewportP **ppIVar3;
  ImGuiID IVar4;
  int iVar5;
  ImGuiSettingsHandler *__dest;
  ImGuiViewportP *pIVar6;
  ImGuiViewportP **__dest_00;
  int iVar7;
  int iVar8;
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    IVar4 = ImHashStr("Window",0,0);
    iVar5 = (context->SettingsHandlers).Size;
    if (iVar5 == (context->SettingsHandlers).Capacity) {
      if (iVar5 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar5 / 2 + iVar5;
      }
      iVar8 = iVar5 + 1;
      if (iVar5 + 1 < iVar7) {
        iVar8 = iVar7;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((long)iVar8 * 0x48,GImAllocatorUserData);
      pIVar2 = (context->SettingsHandlers).Data;
      if (pIVar2 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar2,(long)(context->SettingsHandlers).Size * 0x48);
        pIVar2 = (context->SettingsHandlers).Data;
        if ((pIVar2 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      (context->SettingsHandlers).Data = __dest;
      (context->SettingsHandlers).Capacity = iVar8;
      iVar5 = (context->SettingsHandlers).Size;
    }
    else {
      __dest = (context->SettingsHandlers).Data;
    }
    __dest[iVar5].TypeName = "Window";
    __dest[iVar5].TypeHash = IVar4;
    *(undefined4 *)&__dest[iVar5].field_0xc = 0;
    __dest[iVar5].ClearAllFn = WindowSettingsHandler_ClearAll;
    __dest[iVar5].ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    __dest[iVar5].ReadOpenFn = WindowSettingsHandler_ReadOpen;
    __dest[iVar5].ReadLineFn = WindowSettingsHandler_ReadLine;
    __dest[iVar5].ApplyAllFn = WindowSettingsHandler_ApplyAll;
    __dest[iVar5].WriteAllFn = WindowSettingsHandler_WriteAll;
    __dest[iVar5].UserData = (void *)0x0;
    (context->SettingsHandlers).Size = (context->SettingsHandlers).Size + 1;
    TableSettingsInstallHandler(context);
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    pIVar6 = (ImGuiViewportP *)(*GImAllocatorAllocFunc)(0xb8,GImAllocatorUserData);
    (pIVar6->super_ImGuiViewport).Flags = 0;
    (pIVar6->super_ImGuiViewport).Pos.x = 0.0;
    *(undefined8 *)&(pIVar6->super_ImGuiViewport).Pos.y = 0;
    *(undefined8 *)&(pIVar6->super_ImGuiViewport).Size.y = 0;
    *(undefined8 *)&(pIVar6->super_ImGuiViewport).WorkPos.y = 0;
    *(undefined8 *)&(pIVar6->super_ImGuiViewport).WorkSize.y = 0;
    (pIVar6->super_ImGuiViewport).PlatformHandleRaw = (void *)0x0;
    (pIVar6->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar6->DrawDataP).field_0x1 = 0;
    (pIVar6->DrawDataP).CmdListsCount = 0;
    (pIVar6->DrawDataP).TotalIdxCount = 0;
    (pIVar6->DrawDataP).TotalVtxCount = 0;
    (pIVar6->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar6->DrawDataP).DisplayPos.x = 0.0;
    (pIVar6->DrawDataP).DisplayPos.y = 0.0;
    (pIVar6->DrawDataP).DisplaySize.x = 0.0;
    (pIVar6->DrawDataP).DisplaySize.y = 0.0;
    (pIVar6->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar6->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar6->DrawDataBuilder).Layers[0].Size = 0;
    (pIVar6->DrawDataBuilder).Layers[0].Capacity = 0;
    (pIVar6->DrawDataBuilder).Layers[0].Data = (ImDrawList **)0x0;
    (pIVar6->DrawDataBuilder).Layers[1].Size = 0;
    (pIVar6->DrawDataBuilder).Layers[1].Capacity = 0;
    (pIVar6->DrawDataBuilder).Layers[1].Data = (ImDrawList **)0x0;
    (pIVar6->WorkOffsetMin).x = 0.0;
    (pIVar6->WorkOffsetMin).y = 0.0;
    (pIVar6->WorkOffsetMax).x = 0.0;
    (pIVar6->WorkOffsetMax).y = 0.0;
    (pIVar6->BuildWorkOffsetMin).x = 0.0;
    (pIVar6->BuildWorkOffsetMin).y = 0.0;
    (pIVar6->BuildWorkOffsetMax).x = 0.0;
    (pIVar6->BuildWorkOffsetMax).y = 0.0;
    pIVar6->DrawListsLastFrame[0] = -1;
    pIVar6->DrawListsLastFrame[1] = -1;
    pIVar6->DrawLists[0] = (ImDrawList *)0x0;
    pIVar6->DrawLists[1] = (ImDrawList *)0x0;
    iVar5 = (context->Viewports).Size;
    if (iVar5 == (context->Viewports).Capacity) {
      if (iVar5 == 0) {
        iVar7 = 8;
      }
      else {
        iVar7 = iVar5 / 2 + iVar5;
      }
      iVar8 = iVar5 + 1;
      if (iVar5 + 1 < iVar7) {
        iVar8 = iVar7;
      }
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest_00 = (ImGuiViewportP **)(*GImAllocatorAllocFunc)((long)iVar8 << 3,GImAllocatorUserData)
      ;
      ppIVar3 = (context->Viewports).Data;
      if (ppIVar3 != (ImGuiViewportP **)0x0) {
        memcpy(__dest_00,ppIVar3,(long)(context->Viewports).Size << 3);
        ppIVar3 = (context->Viewports).Data;
        if ((ppIVar3 != (ImGuiViewportP **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      (context->Viewports).Data = __dest_00;
      (context->Viewports).Capacity = iVar8;
      iVar5 = (context->Viewports).Size;
    }
    else {
      __dest_00 = (context->Viewports).Data;
    }
    __dest_00[iVar5] = pIVar6;
    (context->Viewports).Size = (context->Viewports).Size + 1;
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                ,0x1152,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);

#ifdef IMGUI_HAS_DOCK
#endif

    g.Initialized = true;
}